

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

DTLSSentRecord * __thiscall
bssl::InplaceVector<bssl::DTLSSentRecord,_32UL>::PushBack
          (InplaceVector<bssl::DTLSSentRecord,_32UL> *this,DTLSSentRecord val)

{
  DTLSSentRecord *pDVar1;
  DTLSSentRecord *ret;
  InplaceVector<bssl::DTLSSentRecord,_32UL> *this_local;
  
  pDVar1 = TryPushBack(this,val);
  if (pDVar1 == (DTLSSentRecord *)0x0) {
    abort();
  }
  return pDVar1;
}

Assistant:

T &PushBack(T val) {
    T *ret = TryPushBack(std::move(val));
    BSSL_CHECK(ret != nullptr);
    return *ret;
  }